

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

PHYSFS_Io * UNPK_duplicate(PHYSFS_Io *_io)

{
  long *plVar1;
  PHYSFS_Io *__dest;
  long *plVar2;
  long lVar3;
  UNPKfileinfo *finfo;
  PHYSFS_Io *retval;
  PHYSFS_Io *io;
  UNPKfileinfo *origfinfo;
  PHYSFS_Io *_io_local;
  
  plVar1 = (long *)_io->opaque;
  __dest = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  plVar2 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
  if (__dest == (PHYSFS_Io *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else if (plVar2 == (long *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    lVar3 = (**(code **)(*plVar1 + 0x38))(*plVar1);
    if (lVar3 != 0) {
      *plVar2 = lVar3;
      plVar2[1] = plVar1[1];
      *(undefined4 *)(plVar2 + 2) = 0;
      memcpy(__dest,_io,0x50);
      __dest->opaque = plVar2;
      return __dest;
    }
  }
  if (plVar2 != (long *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(plVar2);
  }
  if (__dest != (PHYSFS_Io *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(__dest);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *UNPK_duplicate(PHYSFS_Io *_io)
{
    UNPKfileinfo *origfinfo = (UNPKfileinfo *) _io->opaque;
    PHYSFS_Io *io = NULL;
    PHYSFS_Io *retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    UNPKfileinfo *finfo = (UNPKfileinfo *) allocator.Malloc(sizeof (UNPKfileinfo));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_duplicate_failed);
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_duplicate_failed);

    io = origfinfo->io->duplicate(origfinfo->io);
    if (!io) goto UNPK_duplicate_failed;
    finfo->io = io;
    finfo->entry = origfinfo->entry;
    finfo->curPos = 0;
    memcpy(retval, _io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;
    return retval;

UNPK_duplicate_failed:
    if (finfo != NULL) allocator.Free(finfo);
    if (retval != NULL) allocator.Free(retval);
    if (io != NULL) io->destroy(io);
    return NULL;
}